

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ps.c
# Opt level: O3

void bp_update_ps(mod2sparse *H,char *synd,double *log_prob_ratios,int iter,char *decoding)

{
  int iVar1;
  uint uVar2;
  mod2entry *pmVar3;
  mod2entry *pmVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double in_XMM3_Qa;
  double dVar8;
  double dVar9;
  
  iVar1 = H->n_rows;
  uVar2 = H->n_cols;
  if (0 < (long)iVar1) {
    pmVar3 = H->rows;
    lVar5 = 0;
    do {
      pmVar4 = pmVar3[lVar5].right;
      if (-1 < pmVar4->row) {
        dVar9 = 1.0;
        if (synd[lVar5] != '\0') {
          dVar9 = in_XMM3_Qa;
        }
        dVar8 = -1.0;
        if (synd[lVar5] != '\x01') {
          dVar8 = dVar9;
        }
        do {
          pmVar4->lr = dVar8;
          dVar8 = dVar8 * (2.0 / (pmVar4->pr + 1.0) + -1.0);
          pmVar4 = pmVar4->right;
        } while (-1 < pmVar4->row);
      }
      pmVar4 = pmVar3[lVar5].left;
      in_XMM3_Qa = 1.0;
      if (-1 < pmVar4->row) {
        in_XMM3_Qa = 1.0;
        do {
          dVar9 = pmVar4->lr * in_XMM3_Qa;
          pmVar4->lr = (1.0 - dVar9) / (dVar9 + 1.0);
          in_XMM3_Qa = in_XMM3_Qa * (2.0 / (pmVar4->pr + 1.0) + -1.0);
          pmVar4 = pmVar4->left;
        } while (-1 < pmVar4->row);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  if (0 < (int)uVar2) {
    pmVar3 = H->cols;
    uVar6 = 0;
    do {
      dVar9 = prob_ratio_intial;
      for (pmVar3 = pmVar3[uVar6].down; -1 < pmVar3->row; pmVar3 = pmVar3->down) {
        pmVar3->pr = dVar9;
        dVar9 = dVar9 * pmVar3->lr;
      }
      dVar9 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0x3ff0000000000000)
      ;
      dVar8 = log(1.0 / dVar9);
      log_prob_ratios[uVar6] = dVar8;
      decoding[uVar6] = 1.0 <= dVar9;
      pmVar3 = H->cols;
      pmVar4 = pmVar3[uVar6].up;
      if (-1 < pmVar4->row) {
        dVar9 = 1.0;
        do {
          dVar8 = pmVar4->pr * dVar9;
          uVar7 = -(ulong)NAN(dVar8);
          pmVar4->pr = (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)dVar8);
          dVar9 = dVar9 * pmVar4->lr;
          pmVar4 = pmVar4->up;
        } while (-1 < pmVar4->row);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  return;
}

Assistant:

void bp_update_ps(mod2sparse *H,
    char *synd,
    double *log_prob_ratios,
    int iter,
    char *decoding)
    {
        double pr, dl, t;
        mod2entry *e;
        int N, M;
        int i, j;

        M = mod2sparse_rows(H);
        N = mod2sparse_cols(H);

        /* Recompute likelihood ratios. */

        for (i = 0; i<M; i++)
        {
            if(synd[i]==0) dl = 1;
            if(synd[i]==1) dl=-1;
            for (e = mod2sparse_first_in_row(H,i);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_next_in_row(e))
            { e->lr = dl;
                dl *= 2/(1+e->pr) - 1;
            }
            dl = 1;
            for (e = mod2sparse_last_in_row(H,i);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_prev_in_row(e))
            { t = e->lr * dl;
                e->lr = (1-t)/(1+t);
                dl *= 2/(1+e->pr) - 1;
            }
        }

        /* Recompute probability ratios.  Also find the next guess based on the
           individually most likely values. */

        for (j = 0; j<N; j++)
        { pr = prob_ratio_intial;
            for (e = mod2sparse_first_in_col(H,j);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_next_in_col(e))
            { e->pr = pr;
                pr *= e->lr;
            }
            if (isnan(pr))
            { pr = 1;
            }
            log_prob_ratios[j]=log(1/pr);
            // if (bprb) bprb[j] = 1 - 1/(1+pr);
            decoding[j] = pr>=1;
            pr = 1;
            for (e = mod2sparse_last_in_col(H,j);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_prev_in_col(e))
            { e->pr *= pr;
                if (isnan(e->pr))
                { e->pr = 1;
                }
                pr *= e->lr;
            }
        }

}